

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O2

void lore_append_spell_clause
               (textblock *tb,bitflag *f,_Bool know_hp,monster_race *race,char *conjunction,
               char *end)

{
  monster_spell_level *pmVar1;
  player *p;
  _Bool _Var2;
  int iVar3;
  wchar_t index;
  uint uVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  int iVar7;
  monster_spell *pmVar8;
  monster_spell_level *pmVar9;
  char *pcVar10;
  long lVar11;
  uint8_t attr;
  effect *peVar12;
  bitflag *flags;
  undefined1 *puVar13;
  undefined1 *puVar14;
  byte bVar15;
  player_state_conflict in_stack_fffffffffffffd38;
  undefined1 local_170 [320];
  
  bVar15 = 0;
  iVar3 = flag_count(f,0xd);
  if (iVar3 == 0) {
    return;
  }
  index = flag_next(f,0xd,1);
  do {
    p = player;
    if (index == L'\0') {
      textblock_append(tb,"%s","");
      return;
    }
    pmVar8 = monster_spell_by_index(index);
    peVar12 = pmVar8->effect;
    pmVar1 = pmVar8->level;
    do {
      pmVar9 = pmVar1;
      pmVar1 = pmVar9->next;
      if (pmVar1 == (monster_spell_level *)0x0) break;
    } while (pmVar1->power <= race->spell_power);
    if ((pmVar9->lore_attr_resist == '\0') && (pmVar9->lore_attr_immune == '\0')) {
LAB_00173ca3:
      attr = pmVar9->lore_attr;
    }
    else {
      if (pmVar9->save_message != (char *)0x0) {
        if (L'c' < (p->known_state).skills[3]) {
          attr = pmVar9->lore_attr_resist;
          if (pmVar9->lore_attr_immune != '\0') {
            attr = pmVar9->lore_attr_immune;
          }
          goto LAB_00173ca7;
        }
        if (peVar12->index == 10) {
          _Var2 = player_inc_check(p,peVar12->subtype,true);
          if (!_Var2) goto LAB_00173afb;
        }
        else if (peVar12->index == 0x3d) {
          memcpy(local_170,&p->known_state,0x13c);
          puVar13 = local_170;
          puVar14 = &stack0xfffffffffffffd38;
          for (lVar11 = 0x13c; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar14 = *puVar13;
            puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
            puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
          }
          _Var2 = player_resists_effects(in_stack_fffffffffffffd38,L'\t');
          if (_Var2) {
LAB_00173afb:
            attr = pmVar9->lore_attr_resist;
            goto LAB_00173ca7;
          }
        }
        else if (pmVar9->lore_attr_immune != '\0') {
          for (; peVar12 != (effect *)0x0; peVar12 = peVar12->next) {
            if ((peVar12->index == 10) && (_Var2 = player_inc_check(p,peVar12->subtype,true), _Var2)
               ) goto LAB_00173ca3;
          }
          goto LAB_00173afb;
        }
        goto LAB_00173ca3;
      }
      uVar4 = peVar12->index - 0x4c;
      if ((0xd < uVar4) || ((0x2005U >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_00173ca3;
      wVar5 = peVar12->subtype;
      if ((uint)wVar5 < 0x14) {
        if ((0xa6000U >> (wVar5 & 0x1fU) & 1) == 0) {
          if (wVar5 == L'\a') {
            memcpy(local_170,&p->known_state,0x13c);
            puVar13 = local_170;
            puVar14 = &stack0xfffffffffffffd38;
            for (lVar11 = 0x13c; lVar11 != 0; lVar11 = lVar11 + -1) {
              *puVar14 = *puVar13;
              puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
              puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
            }
            _Var2 = player_resists_effects(in_stack_fffffffffffffd38,L'\a');
            if (_Var2) {
LAB_00173c21:
              attr = pmVar9->lore_attr_immune;
              goto LAB_00173ca7;
            }
            _Var2 = flag_has_dbg((p->known_state).flags,6,9,"p->known_state.flags","OF_PROT_STUN");
            if (_Var2) goto LAB_00173afb;
          }
          else {
            if (wVar5 != L'\t') goto LAB_00173b99;
            memcpy(local_170,&p->known_state,0x13c);
            puVar13 = local_170;
            puVar14 = &stack0xfffffffffffffd38;
            for (lVar11 = 0x13c; lVar11 != 0; lVar11 = lVar11 + -1) {
              *puVar14 = *puVar13;
              puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
              puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
            }
            _Var2 = player_resists_effects(in_stack_fffffffffffffd38,L'\t');
            if (_Var2) goto LAB_00173c21;
            if (L'c' < (p->known_state).skills[3]) goto LAB_00173afb;
          }
        }
        else {
          flags = (p->known_state).flags;
          _Var2 = flag_has_dbg(flags,6,9,"p->known_state.flags","OF_PROT_STUN");
          if (!_Var2) {
LAB_00173c62:
            attr = pmVar9->lore_attr;
            goto LAB_00173ca7;
          }
          _Var2 = flag_has_dbg(flags,6,8,"p->known_state.flags","OF_PROT_CONF");
          if ((_Var2) || (peVar12->subtype != L'\r')) goto LAB_00173afb;
        }
        goto LAB_00173ca3;
      }
LAB_00173b99:
      memcpy(local_170,&p->known_state,0x13c);
      puVar13 = local_170;
      puVar14 = &stack0xfffffffffffffd38;
      for (lVar11 = 0x13c; lVar11 != 0; lVar11 = lVar11 + -1) {
        *puVar14 = *puVar13;
        puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
        puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
      }
      _Var2 = player_is_immune(in_stack_fffffffffffffd38,wVar5);
      if (_Var2) {
        attr = pmVar9->lore_attr_immune;
        if (pmVar9->lore_attr_immune == '\0') goto LAB_00173afb;
      }
      else {
        wVar5 = peVar12->subtype;
        memcpy(local_170,&p->known_state,0x13c);
        puVar13 = local_170;
        puVar14 = &stack0xfffffffffffffd38;
        for (lVar11 = 0x13c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar14 = *puVar13;
          puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
          puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
        }
        _Var2 = player_resists_effects(in_stack_fffffffffffffd38,wVar5);
        if (!_Var2) goto LAB_00173c62;
        attr = pmVar9->lore_attr_resist;
      }
    }
LAB_00173ca7:
    wVar5 = mon_spell_lore_damage(index,race,know_hp);
    wVar6 = flag_next(f,0xd,1);
    if (index != wVar6) {
      if (2 < iVar3) {
        textblock_append(tb,",");
      }
      iVar7 = flag_next(f,0xd,index + L'\x01');
      if (iVar7 == 0) {
        textblock_append(tb," ");
        textblock_append(tb,"%s","or");
      }
      textblock_append(tb," ");
    }
    pcVar10 = mon_spell_lore_description(index,race);
    textblock_append_c(tb,attr,"%s",pcVar10);
    if (L'\0' < wVar5) {
      textblock_append_c(tb,attr," (%d)",(ulong)(uint)wVar5);
    }
    index = flag_next(f,0xd,index + L'\x01');
  } while( true );
}

Assistant:

static void lore_append_spell_clause(textblock *tb, bitflag *f, bool know_hp,
									 const struct monster_race *race,
									 const char *conjunction,
									 const char *end)
{
	int count = rsf_count(f);
	bool comma = count > 2;

	if (count) {
		int spell;
		for (spell = rsf_next(f, FLAG_START); spell;
			 spell = rsf_next(f, spell + 1)) {
			int color = spell_color(player, race, spell);
			int damage = mon_spell_lore_damage(spell, race, know_hp);

			/* First entry starts immediately */
			if (spell != rsf_next(f, FLAG_START)) {
				if (comma) {
					textblock_append(tb, ",");
				}
				/* Last entry */
				if (rsf_next(f, spell + 1) == FLAG_END) {
					textblock_append(tb, " ");
					textblock_append(tb, "%s", conjunction);
				}
				textblock_append(tb, " ");
			}
			textblock_append_c(tb, color, "%s",
							   mon_spell_lore_description(spell, race));
			if (damage > 0) {
				textblock_append_c(tb, color, " (%d)", damage);
			}
		}
		textblock_append(tb, "%s", end);
	}
}